

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O3

int __thiscall
particleSamples::read_in_particle_samples_SMASH_mixed_event_gzipped(particleSamples *this)

{
  vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
  *this_00;
  iterator __position;
  vector<particle_info,std::allocator<particle_info>> *this_01;
  undefined4 uVar1;
  undefined8 this_02;
  int iVar2;
  istream *piVar3;
  long lVar4;
  long lVar5;
  anon_struct_120_15_f999644b *paVar6;
  particleSamples *ppVar7;
  iterator __position_00;
  byte bVar8;
  int n_particle;
  int pdg_id;
  int charge;
  int pdg_mother2;
  int pdg_mother1;
  int parent_proc_type;
  string temp_string;
  particle_info temp_particle_info;
  stringstream temp1;
  stringstream temp2;
  int local_404;
  undefined1 local_400 [40];
  pointer local_3d8;
  undefined1 local_3d0 [24];
  anon_struct_120_15_f999644b local_3b8;
  undefined1 local_340 [128];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> abStack_2c0 [8];
  string local_1b8 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> abStack_138 [8];
  
  bVar8 = 0;
  ppVar7 = (particleSamples *)this->full_particle_list_mixed_event;
  clear_out_previous_record
            (this,(vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   *)ppVar7);
  local_3d8 = (pointer)(local_3d0 + 8);
  local_3d0._0_8_ = 0;
  local_3d0[8] = 0;
  if (0 < this->event_buffer_size) {
    local_400._16_8_ = abStack_138;
    local_400._8_8_ = abStack_2c0;
    lVar5 = 0;
    local_404 = 0;
    do {
      this_02 = local_400._16_8_;
      gz_readline_abi_cxx11_((string *)local_340,ppVar7,this->inputfile_mixed_event_gz);
      std::__cxx11::string::operator=((string *)&local_3d8,(string *)local_340);
      if ((vector<particle_info,_std::allocator<particle_info>_> *)local_340._0_8_ !=
          (vector<particle_info,_std::allocator<particle_info>_> *)(local_340 + 0x10)) {
        operator_delete((void *)local_340._0_8_);
      }
      iVar2 = gzeof(this->inputfile_mixed_event_gz);
      if (iVar2 != 0) break;
      this_00 = (vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
                 *)this->full_particle_list_mixed_event;
      local_340._0_8_ = operator_new(0x18);
      (((vector<particle_info,_std::allocator<particle_info>_> *)local_340._0_8_)->
      super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (((vector<particle_info,_std::allocator<particle_info>_> *)local_340._0_8_)->
      super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (((vector<particle_info,_std::allocator<particle_info>_> *)local_340._0_8_)->
      super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __position._M_current =
           *(vector<particle_info,_std::allocator<particle_info>_> ***)(this_00 + 8);
      if (__position._M_current ==
          *(vector<particle_info,_std::allocator<particle_info>_> ***)(this_00 + 0x10)) {
        std::
        vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
        ::_M_realloc_insert<std::vector<particle_info,std::allocator<particle_info>>*>
                  (this_00,__position,
                   (vector<particle_info,_std::allocator<particle_info>_> **)local_340);
      }
      else {
        *__position._M_current =
             (vector<particle_info,_std::allocator<particle_info>_> *)local_340._0_8_;
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
      }
      std::__cxx11::stringstream::stringstream
                ((stringstream *)local_340,(string *)&local_3d8,_S_out|_S_in);
      ppVar7 = (particleSamples *)local_400;
      std::istream::operator>>((istream *)local_340,(int *)ppVar7);
      if (0 < (int)local_400._0_4_) {
        iVar2 = 0;
        do {
          gz_readline_abi_cxx11_(local_1b8,ppVar7,this->inputfile_mixed_event_gz);
          std::__cxx11::string::operator=((string *)&local_3d8,(string *)local_1b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8[0]._M_dataplus._M_p != &local_1b8[0].field_2) {
            operator_delete(local_1b8[0]._M_dataplus._M_p);
          }
          std::__cxx11::stringstream::stringstream
                    ((stringstream *)local_1b8,(string *)&local_3d8,_S_out|_S_in);
          piVar3 = (istream *)std::istream::operator>>((istream *)local_1b8,(int *)(local_400 + 4));
          piVar3 = (istream *)std::istream::operator>>(piVar3,(int *)(local_400 + 0x18));
          piVar3 = (istream *)std::istream::operator>>(piVar3,(int *)(local_400 + 0x24));
          piVar3 = (istream *)std::istream::operator>>(piVar3,(int *)(local_400 + 0x20));
          std::istream::operator>>(piVar3,(int *)(local_400 + 0x1c));
          piVar3 = std::istream::_M_extract<double>((double *)local_1b8);
          piVar3 = std::istream::_M_extract<double>((double *)piVar3);
          piVar3 = std::istream::_M_extract<double>((double *)piVar3);
          piVar3 = std::istream::_M_extract<double>((double *)piVar3);
          piVar3 = std::istream::_M_extract<double>((double *)piVar3);
          piVar3 = std::istream::_M_extract<double>((double *)piVar3);
          piVar3 = std::istream::_M_extract<double>((double *)piVar3);
          piVar3 = std::istream::_M_extract<double>((double *)piVar3);
          std::istream::_M_extract<double>((double *)piVar3);
          local_3b8.monval = local_400._4_4_;
          this_01 = (vector<particle_info,std::allocator<particle_info>> *)
                    (this->full_particle_list_mixed_event->
                    super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                    )._M_impl.super__Vector_impl_data._M_start[lVar5];
          __position_00._M_current = *(anon_struct_120_15_f999644b **)(this_01 + 8);
          if (__position_00._M_current == *(anon_struct_120_15_f999644b **)(this_01 + 0x10)) {
            std::vector<particle_info,std::allocator<particle_info>>::
            _M_realloc_insert<particle_info_const&>(this_01,__position_00,&local_3b8);
          }
          else {
            paVar6 = &local_3b8;
            for (lVar4 = 0xf; lVar4 != 0; lVar4 = lVar4 + -1) {
              uVar1 = *(undefined4 *)&paVar6->field_0x4;
              (__position_00._M_current)->monval = paVar6->monval;
              *(undefined4 *)&(__position_00._M_current)->field_0x4 = uVar1;
              paVar6 = (anon_struct_120_15_f999644b *)((long)paVar6 + ((ulong)bVar8 * -2 + 1) * 8);
              __position_00._M_current = __position_00._M_current + (ulong)bVar8 * -0x10 + 8;
            }
            *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 0x78;
          }
          ppVar7 = (particleSamples *)&std::__cxx11::stringstream::VTT;
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base((ios_base *)this_02);
          iVar2 = iVar2 + 1;
        } while (iVar2 < (int)local_400._0_4_);
      }
      local_404 = local_404 + local_400._0_4_;
      lVar5 = lVar5 + 1;
      ppVar7 = (particleSamples *)&std::__cxx11::stringstream::VTT;
      std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
      std::ios_base::~ios_base((ios_base *)local_400._8_8_);
    } while (local_404 < this->event_buffer_size);
    if (local_3d8 != (pointer)(local_3d0 + 8)) {
      operator_delete(local_3d8);
    }
  }
  return 0;
}

Assistant:

int particleSamples::read_in_particle_samples_SMASH_mixed_event_gzipped() {
    // clean out the previous record
    clear_out_previous_record(full_particle_list_mixed_event);

    std::string temp_string;
    int n_particle;
    int parent_proc_type;
    int pdg_mother1, pdg_mother2;
    int pdg_id, charge;
    int ievent = 0;
    int num_particles = 0;
    while (num_particles < event_buffer_size) {
        temp_string = gz_readline(inputfile_mixed_event_gz);

        if (gzeof(inputfile_mixed_event_gz)) break;

        full_particle_list_mixed_event->push_back(new vector<particle_info>);

        // get number of particles within the event
        std::stringstream temp1(temp_string);
        temp1 >> n_particle;
        for (int ipart = 0; ipart < n_particle; ipart++) {
            temp_string = gz_readline(inputfile_mixed_event_gz);
            std::stringstream temp2(temp_string);
            temp2 >> pdg_id >> charge >> parent_proc_type >> pdg_mother1
                >> pdg_mother2;

            particle_info temp_particle_info;
            temp2 >> temp_particle_info.mass >> temp_particle_info.t
                >> temp_particle_info.x >> temp_particle_info.y
                >> temp_particle_info.z >> temp_particle_info.E
                >> temp_particle_info.px >> temp_particle_info.py
                >> temp_particle_info.pz;
            temp_particle_info.monval = pdg_id;
            (*full_particle_list_mixed_event)[ievent]->push_back(
                temp_particle_info);
        }
        num_particles += n_particle;
        ievent++;
    }
    return (0);
}